

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_java_validator(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_type *ptVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  pointer pptVar8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public void validate() throws org.apache.thrift.TException {",0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"// check for required fields",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    if ((*pptVar8)->req_ == T_REQUIRED) {
      if (this->bean_style_ == true) {
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (!",5);
        generate_isset_check_abi_cxx11_(&local_50,this,*pptVar8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'",
                   0x4b);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\' is unset! Struct:\" + toString());",0x23);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else {
        bVar3 = type_can_be_null(this,(*pptVar8)->type_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," == null) {",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'"
                     ,0x4b);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\' was not present! Struct: \" + toString());",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar5 = t_generator::indent((t_generator *)this,out);
          lVar6 = 1;
          pcVar7 = "}";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"// alas, we cannot check \'",0x1a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          lVar6 = 0x41;
          pcVar7 = "\' because it\'s a primitive and you chose the non-beans generator.";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
    }
  }
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"// check for sub-struct validity",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = (*pptVar8)->type_;
      iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
      if (((char)iVar4 != '\0') && (ptVar2[1].annotations_._M_t._M_impl.field_0x1 == '\0')) {
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," != null) {",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".validate();",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public void validate() throws org.apache.thrift.TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (bean_style_) {
        out << indent() << "if (!" << generate_isset_check(*f_iter) << ") {" << endl << indent()
            << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
            << (*f_iter)->get_name() << "' is unset! Struct:\" + toString());" << endl << indent()
            << "}" << endl << endl;
      } else {
        if (type_can_be_null((*f_iter)->get_type())) {
          indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
          indent(out)
              << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
              << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
          indent(out) << "}" << endl;
        } else {
          indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                      << "' because it's a primitive and you chose the non-beans generator."
                      << endl;
        }
      }
    }
  }

  out << indent() << "// check for sub-struct validity" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_type* type = (*f_iter)->get_type();
    if (type->is_struct() && !((t_struct*)type)->is_union()) {
      out << indent() << "if (" << (*f_iter)->get_name() << " != null) {" << endl;
      out << indent() << "  " << (*f_iter)->get_name() << ".validate();" << endl;
      out << indent() << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}